

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

void __thiscall
TasGrid::GridSequence::integrateHierarchicalFunctions(GridSequence *this,double *integrals)

{
  bool bVar1;
  int *piVar2;
  reference pvVar3;
  MultiIndexSet *local_80;
  int local_6c;
  value_type vStack_68;
  int j;
  double w;
  int *p;
  undefined1 local_40 [4];
  int i;
  vector<double,_std::allocator<double>_> integ;
  int num_points;
  MultiIndexSet *work;
  double *integrals_local;
  GridSequence *this_local;
  
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (bVar1) {
    local_80 = &(this->super_BaseCanonicalGrid).needed;
  }
  else {
    local_80 = &(this->super_BaseCanonicalGrid).points;
  }
  integ.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = MultiIndexSet::getNumIndexes(local_80);
  cacheBasisIntegrals((vector<double,_std::allocator<double>_> *)local_40,this);
  for (p._4_4_ = 0;
      p._4_4_ < integ.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_; p._4_4_ = p._4_4_ + 1) {
    piVar2 = MultiIndexSet::getIndex(local_80,p._4_4_);
    pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_40,(long)*piVar2);
    vStack_68 = *pvVar3;
    for (local_6c = 1; local_6c < (this->super_BaseCanonicalGrid).num_dimensions;
        local_6c = local_6c + 1) {
      pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_40,(long)piVar2[local_6c]
                         );
      vStack_68 = *pvVar3 * vStack_68;
    }
    integrals[p._4_4_] = vStack_68;
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return;
}

Assistant:

void GridSequence::integrateHierarchicalFunctions(double integrals[]) const{
    const MultiIndexSet& work = (points.empty()) ? needed : points;
    int const num_points = work.getNumIndexes();
    std::vector<double> integ = cacheBasisIntegrals();
    for(int i=0; i<num_points; i++){
        const int* p = work.getIndex(i);
        double w = integ[p[0]];
        for(int j=1; j<num_dimensions; j++){
            w *= integ[p[j]];
        }
        integrals[i] = w;
    }
}